

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayhelper.cpp
# Opt level: O2

double * ArrayHelper::getArray(size_t rows,size_t cols,bool zero)

{
  double *pdVar1;
  undefined7 in_register_00000011;
  size_t sVar2;
  double *pdVar3;
  size_t sVar4;
  
  pdVar1 = (double *)operator_new__(-(ulong)(cols * rows >> 0x3d != 0) | cols * rows * 8);
  if ((int)CONCAT71(in_register_00000011,zero) != 0) {
    pdVar3 = pdVar1;
    for (sVar2 = 0; sVar2 != rows; sVar2 = sVar2 + 1) {
      for (sVar4 = 0; cols != sVar4; sVar4 = sVar4 + 1) {
        pdVar3[sVar4] = 0.0;
      }
      pdVar3 = pdVar3 + cols;
    }
  }
  return pdVar1;
}

Assistant:

double* ArrayHelper::getArray(size_t rows, size_t cols, bool zero) {
	double* array = new double[rows*cols];
	if (zero) {
		for (size_t i = 0; i < rows; i++) {
			for (size_t j = 0; j < cols; j++) {
				array[i * cols + j] = 0;
			}
		}
	} 
	return array;
}